

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O2

void __thiscall
capnp::JsonCodec::encodeField(JsonCodec *this,Field field,Reader *input,Builder output)

{
  HandlerBase *pHVar1;
  Maybe<capnp::JsonCodec::HandlerBase_*const_&> MVar2;
  Reader *this_00;
  Type type;
  Reader local_b8;
  Reader local_70;
  
  MVar2 = kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::
          find<capnp::StructSchema::Field&>
                    ((HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*> *)
                     &((this->impl).ptr)->fieldHandlers,&field);
  if (MVar2.ptr == (HandlerBase **)0x0) {
    this_00 = &local_b8;
    DynamicValue::Reader::Reader(this_00,input);
    type = StructSchema::Field::getType(&field);
    encode(this,this_00,type,output);
  }
  else {
    pHVar1 = *MVar2.ptr;
    this_00 = &local_70;
    DynamicValue::Reader::Reader(this_00,input);
    (**pHVar1->_vptr_HandlerBase)(pHVar1,this,this_00);
  }
  DynamicValue::Reader::~Reader(this_00);
  return;
}

Assistant:

void JsonCodec::encodeField(StructSchema::Field field, DynamicValue::Reader input,
                            JsonValue::Builder output) const {
  KJ_IF_MAYBE(handler, impl->fieldHandlers.find(field)) {
    (*handler)->encodeBase(*this, input, output);
    return;
  }

  encode(input, field.getType(), output);
}